

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

void Emb_ManSetValue(Emb_Man_t *p)

{
  int iVar1;
  bool bVar2;
  uint local_20;
  uint local_1c;
  int Counter;
  int i;
  Emb_Obj_t *pObj;
  Emb_Man_t *p_local;
  
  local_20 = 0;
  local_1c = 0;
  while( true ) {
    bVar2 = false;
    if ((int)local_1c < p->nObjData) {
      _Counter = Emb_ManObj(p,local_1c);
      bVar2 = _Counter != (Emb_Obj_t *)0x0;
    }
    if (!bVar2) break;
    (_Counter->field_8).Value = local_20;
    iVar1 = Emb_ObjSize(_Counter);
    local_1c = iVar1 + local_1c;
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void Emb_ManSetValue( Emb_Man_t * p )  
{
    Emb_Obj_t * pObj;
    int i, Counter = 0;
    Emb_ManForEachObj( p, pObj, i )
    {
        pObj->Value = Counter++;
//        if ( pObj->fCi && pObj->nFanins == 0 ) 
//            printf( "CI:  Handle = %8d.  Value = %6d. Fanins = %d.\n", pObj->hHandle, pObj->Value, pObj->nFanins );
    }
}